

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O3

int Scl_CommandStime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  SC_Lib *pLib;
  int iVar1;
  uint nTreeCRatio;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  FILE *__s;
  char *pcVar4;
  size_t __size;
  char *pcVar5;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_44 = 0;
  Extra_UtilGetoptReset();
  local_48 = 0;
  local_40 = 0;
  local_3c = 0;
  nTreeCRatio = 0;
  while( true ) {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Xcapdh"), iVar2 = globalUtilOptind, iVar1 != 0x58) {
      if (iVar1 < 99) {
        if (iVar1 == -1) {
          pAVar3 = Abc_FrameReadNtk(pAbc);
          if (pAVar3 == (Abc_Ntk_t *)0x0) {
            __s = (FILE *)pAbc->Err;
            pcVar4 = "There is no current network.\n";
            __size = 0x1d;
          }
          else {
            pAVar3 = Abc_FrameReadNtk(pAbc);
            if (pAVar3->ntkFunc == ABC_FUNC_MAP) {
              pAVar3 = Abc_FrameReadNtk(pAbc);
              iVar2 = Abc_SclCheckNtk(pAVar3,0);
              if (iVar2 == 0) {
                __s = (FILE *)pAbc->Err;
                pcVar4 = "The current network is not in a topo order (run \"topo\").\n";
                __size = 0x39;
              }
              else {
                pLib = (SC_Lib *)pAbc->pLibScl;
                if (pLib != (SC_Lib *)0x0) {
                  pAVar3 = Abc_FrameReadNtk(pAbc);
                  Abc_SclTimePerform(pLib,pAVar3,nTreeCRatio,local_48,local_44,local_40,local_3c);
                  return 0;
                }
                __s = (FILE *)pAbc->Err;
                pcVar4 = "There is no Liberty library available.\n";
                __size = 0x27;
              }
            }
            else {
              __s = (FILE *)pAbc->Err;
              pcVar4 = "The current network is not mapped.\n";
              __size = 0x23;
            }
          }
          goto LAB_003c0c86;
        }
        if (iVar1 != 0x61) goto LAB_003c0ba2;
        local_44 = local_44 ^ 1;
      }
      else if (iVar1 == 99) {
        local_48 = local_48 ^ 1;
      }
      else if (iVar1 == 100) {
        local_3c = local_3c ^ 1;
      }
      else {
        if (iVar1 != 0x70) goto LAB_003c0ba2;
        local_40 = local_40 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    nTreeCRatio = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)nTreeCRatio < 0) {
LAB_003c0ba2:
      fwrite("usage: stime [-X num] [-capdth]\n",0x20,1,(FILE *)pAbc->Err);
      fwrite("\t         performs STA using Liberty library\n",0x2d,1,(FILE *)pAbc->Err);
      fprintf((FILE *)pAbc->Err,
              "\t-X     : min Cout/Cave ratio for tree estimations [default = %d]\n",
              (ulong)nTreeCRatio);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-c     : toggle using wire-loads if specified [default = %s]\n",
              pcVar4);
      pcVar4 = "yes";
      if (local_44 == 0) {
        pcVar4 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-a     : display timing information for all nodes [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_40 == 0) {
        pcVar4 = "no";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-p     : display timing information for critical path [default = %s]\n",pcVar4);
      if (local_3c == 0) {
        pcVar5 = "no";
      }
      fprintf((FILE *)pAbc->Err,"\t-d     : toggle dumping statistics into a file [default = %s]\n",
              pcVar5);
      __s = (FILE *)pAbc->Err;
      pcVar4 = "\t-h     : print the help massage\n";
      __size = 0x21;
LAB_003c0c86:
      fwrite(pcVar4,__size,1,__s);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-X\" should be followed by a positive integer.\n");
  goto LAB_003c0ba2;
}

Assistant:

int Scl_CommandStime( Abc_Frame_t * pAbc, int argc, char **argv )
{
    int c;
    int fShowAll      = 0;
    int fUseWireLoads = 0;
    int fPrintPath    = 0;
    int fDumpStats    = 0;
    int nTreeCRatio   = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Xcapdh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'X':
                if ( globalUtilOptind >= argc )
                {
                    Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer.\n" );
                    goto usage;
                }
                nTreeCRatio = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nTreeCRatio < 0 ) 
                    goto usage;
                break;
            case 'c':
                fUseWireLoads ^= 1;
                break;
            case 'a':
                fShowAll ^= 1;
                break;
            case 'p':
                fPrintPath ^= 1;
                break;
            case 'd':
                fDumpStats ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }

    if ( Abc_FrameReadNtk(pAbc) == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(Abc_FrameReadNtk(pAbc)) )
    {
        fprintf( pAbc->Err, "The current network is not mapped.\n" );
        return 1;
    }
    if ( !Abc_SclCheckNtk(Abc_FrameReadNtk(pAbc), 0) )
    {
        fprintf( pAbc->Err, "The current network is not in a topo order (run \"topo\").\n" );
        return 1;
    }
    if ( pAbc->pLibScl == NULL )
    {
        fprintf( pAbc->Err, "There is no Liberty library available.\n" );
        return 1;
    }

    Abc_SclTimePerform( (SC_Lib *)pAbc->pLibScl, Abc_FrameReadNtk(pAbc), nTreeCRatio, fUseWireLoads, fShowAll, fPrintPath, fDumpStats );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: stime [-X num] [-capdth]\n" );
    fprintf( pAbc->Err, "\t         performs STA using Liberty library\n" );
    fprintf( pAbc->Err, "\t-X     : min Cout/Cave ratio for tree estimations [default = %d]\n", nTreeCRatio );
    fprintf( pAbc->Err, "\t-c     : toggle using wire-loads if specified [default = %s]\n", fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-a     : display timing information for all nodes [default = %s]\n", fShowAll? "yes": "no" );
    fprintf( pAbc->Err, "\t-p     : display timing information for critical path [default = %s]\n", fPrintPath? "yes": "no" );
    fprintf( pAbc->Err, "\t-d     : toggle dumping statistics into a file [default = %s]\n", fDumpStats? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : print the help massage\n" );
    return 1;
}